

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O1

void stream_read_callback(pa_stream *s,size_t nbytes,void *u)

{
  cubeb_log_level cVar1;
  int iVar2;
  cubeb_log_callback p_Var3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  pa_sample_spec *ppVar7;
  void *read_data;
  size_t read_size;
  void *local_50;
  ulong local_48;
  pa_sample_spec *local_40;
  pa_sample_spec *local_38;
  
  cVar1 = cubeb_log_get_level();
  if ((CUBEB_LOG_NORMAL < cVar1) &&
     (p_Var3 = cubeb_log_get_callback(), p_Var3 != (cubeb_log_callback)0x0)) {
    cubeb_log_internal("cubeb_pulse.c",0x171,"Input callback buffer size %zd",nbytes);
  }
  if (*(int *)((long)u + 0x50) == 0) {
    local_50 = (void *)0x0;
    ppVar7 = (pa_sample_spec *)((long)u + 0x44);
    local_38 = (pa_sample_spec *)((long)u + 0x38);
    local_40 = ppVar7;
    do {
      sVar4 = (*cubeb_pa_stream_readable_size)(s);
      if (sVar4 == 0) {
        return;
      }
      iVar2 = (*cubeb_pa_stream_peek)(s,&local_50,&local_48);
      if ((int)sVar4 < 1) {
        return;
      }
      if (iVar2 < 0) {
        return;
      }
      if (local_50 != (void *)0x0) {
        sVar4 = (*cubeb_pa_frame_size)(ppVar7);
        uVar5 = local_48 / sVar4;
        if (*(long *)((long)u + 0x10) == 0) {
          iVar2 = 0;
          uVar6 = (**(code **)((long)u + 0x20))(u,*(undefined8 *)((long)u + 8),local_50,0,uVar5);
          if (uVar6 != uVar5 || (long)uVar6 < 0) {
            (*cubeb_pa_stream_cancel_write)(s);
            *(undefined4 *)((long)u + 0x50) = 1;
            iVar2 = 5;
            if ((long)uVar6 < 0) {
              (**(code **)((long)u + 0x28))(u,*(undefined8 *)((long)u + 8),3);
            }
          }
          ppVar7 = local_40;
          if (uVar6 == uVar5 && (long)uVar6 >= 0) goto LAB_0010eb8c;
        }
        else {
          sVar4 = (*cubeb_pa_frame_size)(local_38);
          trigger_user_callback
                    (*(pa_stream **)((long)u + 0x10),local_50,uVar5 * sVar4,
                     (cubeb_stream_conflict *)u);
LAB_0010eb8c:
          iVar2 = 0;
        }
        if (iVar2 != 0) {
          return;
        }
      }
      if (local_48 != 0) {
        (*cubeb_pa_stream_drop)(s);
      }
    } while (*(int *)((long)u + 0x50) == 0);
  }
  return;
}

Assistant:

static void
stream_read_callback(pa_stream * s, size_t nbytes, void * u)
{
  LOGV("Input callback buffer size %zd", nbytes);
  cubeb_stream * stm = u;
  if (stm->shutdown) {
    return;
  }

  void const * read_data = NULL;
  size_t read_size;
  while (read_from_input(s, &read_data, &read_size) > 0) {
    /* read_data can be NULL in case of a hole. */
    if (read_data) {
      size_t in_frame_size = WRAP(pa_frame_size)(&stm->input_sample_spec);
      size_t read_frames = read_size / in_frame_size;

      if (stm->output_stream) {
        // input/capture + output/playback operation
        size_t out_frame_size = WRAP(pa_frame_size)(&stm->output_sample_spec);
        size_t write_size = read_frames * out_frame_size;
        // Offer full duplex data for writing
        trigger_user_callback(stm->output_stream, read_data, write_size, stm);
      } else {
        // input/capture only operation. Call callback directly
        long got = stm->data_callback(stm, stm->user_ptr, read_data, NULL,
                                      read_frames);
        if (got < 0 || (size_t)got != read_frames) {
          WRAP(pa_stream_cancel_write)(s);
          stm->shutdown = 1;
          if (got < 0) {
            stm->state_callback(stm, stm->user_ptr, CUBEB_STATE_ERROR);
          }
          break;
        }
      }
    }
    if (read_size > 0) {
      WRAP(pa_stream_drop)(s);
    }

    if (stm->shutdown) {
      return;
    }
  }
}